

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O2

bool __thiscall ON_3dmObjectAttributes::Write(ON_3dmObjectAttributes *this,ON_BinaryArchive *file)

{
  ON__INT32 i;
  ON_DisplayMaterialRef *pOVar1;
  bool bVar2;
  ON__UINT8 c;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar4 = ON_BinaryArchive::Archive3dmVersion(file);
  if (4 < iVar4) {
    bVar2 = Internal_WriteV5(this,file);
    return bVar2;
  }
  bVar2 = ON_BinaryArchive::Write3dmChunkVersion(file,1,8);
  if (bVar2) {
    bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_uuid);
    if (bVar2) {
      bVar2 = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,Layer,this->m_layer_index);
      if (bVar2) {
        bVar2 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                          (file,Material,this->m_material_index);
        if (bVar2) {
          bVar2 = ON_BinaryArchive::WriteColor(file,&this->m_color);
          if (bVar2) {
            bVar2 = ON_BinaryArchive::WriteShort(file,(short)this->m_object_decoration);
            if (bVar2) {
              bVar2 = ON_BinaryArchive::WriteShort(file,0);
              if (bVar2) {
                bVar2 = ON_BinaryArchive::WriteDouble(file,0.0);
                if (bVar2) {
                  bVar2 = ON_BinaryArchive::WriteDouble(file,1.0);
                  if (bVar2) {
                    bVar2 = ON_BinaryArchive::WriteInt(file,this->m_wire_density);
                    if (bVar2) {
                      bVar2 = ON_BinaryArchive::WriteChar(file,this->m_mode);
                      if (bVar2) {
                        bVar2 = ON_BinaryArchive::WriteChar(file,this->m_color_source);
                        if (bVar2) {
                          bVar2 = ON_BinaryArchive::WriteChar(file,this->m_linetype_source);
                          if (bVar2) {
                            bVar2 = ON_BinaryArchive::WriteChar(file,this->m_material_source);
                            if (bVar2) {
                              bVar2 = ON_BinaryArchive::WriteString(file,&this->m_name);
                              if (bVar2) {
                                ON_BinaryArchive::WriteString(file,&this->m_url);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  i = (this->m_group).m_count;
  bVar2 = ON_BinaryArchive::WriteInt(file,i);
  lVar6 = 0;
  while ((lVar6 < i && (bVar2 != false))) {
    bVar2 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                      (file,Group,(this->m_group).m_a[lVar6]);
    lVar6 = lVar6 + 1;
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteBool(file,this->m_bVisible);
    if (bVar2) {
      bVar2 = ON_BinaryArchive::WriteArray(file,&this->m_dmref);
      if (bVar2) {
        bVar2 = ON_BinaryArchive::WriteInt(file,this->m_object_decoration);
        if (bVar2) {
          bVar2 = ON_BinaryArchive::WriteChar(file,this->m_plot_color_source);
          if (bVar2) {
            bVar2 = ON_BinaryArchive::WriteColor(file,&this->m_plot_color);
            if (bVar2) {
              bVar2 = ON_BinaryArchive::WriteChar(file,this->m_plot_weight_source);
              if (bVar2) {
                bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_plot_weight_mm);
                if (bVar2) {
                  bVar2 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                                    (file,LinePattern,this->m_linetype_index);
                  if (bVar2) {
                    if (this->m_space - 3 < 2) {
                      ON_REMOVE_ASAP_AssertEx
                                (0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_attributes.cpp"
                                 ,0x623,"","false is false");
                      c = '\x02';
                    }
                    else if (this->m_space == page_space) {
                      c = '\x01';
                    }
                    else {
                      c = '\0';
                    }
                    bVar2 = ON_BinaryArchive::WriteChar(file,c);
                    if (bVar2) {
                      iVar4 = (this->m_dmref).m_count;
                      bVar2 = false;
                      iVar5 = 0;
                      if (0 < iVar4) {
                        iVar5 = iVar4;
                      }
                      if (this->m_space == page_space) {
                        bVar2 = ON_UuidIsNil(&this->m_viewport_id);
                        bVar2 = !bVar2;
                      }
                      bVar3 = ON_BinaryArchive::WriteInt(file,iVar5 + (uint)bVar2);
                      if ((bVar2 & bVar3) == 1) {
                        bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_viewport_id);
                        if (bVar2) {
                          bVar3 = ON_BinaryArchive::WriteUuid(file,&ON_ObsoletePageSpaceObjectId);
                        }
                        else {
                          bVar3 = false;
                        }
                      }
                      lVar6 = 0;
                      for (lVar7 = 0; (bVar3 != false && (lVar7 < iVar4)); lVar7 = lVar7 + 1) {
                        pOVar1 = (this->m_dmref).m_a;
                        bVar2 = ON_BinaryArchive::WriteUuid
                                          (file,(ON_UUID *)
                                                ((pOVar1->m_viewport_id).Data4 + lVar6 + -8));
                        if (bVar2) {
                          bVar3 = ON_BinaryArchive::WriteUuid
                                            (file,(ON_UUID *)
                                                  ((pOVar1->m_display_material_id).Data4 +
                                                  lVar6 + -8));
                        }
                        else {
                          bVar3 = false;
                        }
                        lVar6 = lVar6 + 0x20;
                      }
                      if (bVar3 != false) {
                        bVar2 = ON_ObjectRenderingAttributes::Write
                                          (&this->m_rendering_attributes,file);
                        return bVar2;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_3dmObjectAttributes::Write( ON_BinaryArchive& file ) const
{
  if ( file.Archive3dmVersion() >= 5 )
  {
    // added at opennurbs version 200712190
    return Internal_WriteV5(file);
  }

  bool rc = file.Write3dmChunkVersion(1,8);
  // version 1.0 fields
  if (rc) rc = file.WriteUuid(m_uuid);
  if (rc) rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::Layer, m_layer_index);
  if (rc) rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::RenderMaterial, m_material_index);
  if (rc) rc = file.WriteColor(m_color);

  if (rc)
  {
    // OBSOLETE if (rc) rc = file.WriteLineStyle(m_line_style); // 23 March 2005 Dale Lear
    short s;
    s = (short)m_object_decoration;
    if (rc) rc = file.WriteShort(s);
    s = 0;
    if (rc) rc = file.WriteShort(s);
    if (rc) rc = file.WriteDouble(0.0);
    if (rc) rc = file.WriteDouble(1.0);
  }

  if (rc) rc = file.WriteInt(m_wire_density);
  if (rc) rc = file.WriteChar(m_mode);
  if (rc) rc = file.WriteChar(m_color_source);
  if (rc) rc = file.WriteChar(m_linetype_source);
  if (rc) rc = file.WriteChar(m_material_source);
  if (rc) rc = file.WriteString(m_name);
  if (rc) rc = file.WriteString(m_url);

  // version 1.1 fields
  int count = m_group.Count();
  rc = file.WriteInt(count);
  for ( int i = 0; i < count && rc; i++)
    rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::Group, m_group[i]);

  // version 1.2 fields
  if (rc) rc = file.WriteBool(m_bVisible);

  // version 1.3 fields
  if (rc) rc = file.WriteArray(m_dmref);

  // version 1.4 fields - 23 March 2005 Dale Lear
  if (rc) rc = file.WriteInt(m_object_decoration);
  if (rc) rc = file.WriteChar(m_plot_color_source);
  if (rc) rc = file.WriteColor(m_plot_color);
  if (rc) rc = file.WriteChar(m_plot_weight_source);
  if (rc) rc = file.WriteDouble(m_plot_weight_mm);

  // version 1.5 fields 11 April 2005
  if (rc) rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::LinePattern, m_linetype_index );

  // version 1.6 fields 2 September 2005
  if (rc)
  {
    unsigned char uc = 0;
    switch(m_space)
    {
    case ON::no_space:    uc = 0; break;
    case ON::model_space: uc = 0; break;
    case ON::page_space:  uc = 1; break;
    case ON::uveditor_space:
    case ON::blockeditor_space:
        {
            uc = 2;
            ON_ASSERT(false);
            break;
        }
    }
    rc = file.WriteChar(uc);
  }
  if (rc)
  {
    // 22 Sep 2006 - the way ON_3dmObjectAttributes indicates
    // that an object is put on a particular page view changed
    // from being saved in the m_dmref[] list to using the
    // m_space and m_viewport_id settings.  But the file format
    // cannot change at this point.  So, the bAddPagespaceDMR
    // is here to save the page info in the old dmr format.
    int count_local = m_dmref.Count();
    if ( count_local < 0 )
      count_local = 0;
    bool bAddPagespaceDMR = ( ON::page_space == m_space && !ON_UuidIsNil(m_viewport_id) );
    rc = file.WriteInt( bAddPagespaceDMR ? (count_local+1) : count_local );
    if ( rc && bAddPagespaceDMR )
    {
      rc = file.WriteUuid(m_viewport_id);
      if (rc) rc = file.WriteUuid(ON_ObsoletePageSpaceObjectId);
    }
    int i;
    for ( i = 0; i < count_local && rc; i++ )
    {
      const ON_DisplayMaterialRef& dmr = m_dmref[i];
      rc = file.WriteUuid(dmr.m_viewport_id);
      if (rc) rc = file.WriteUuid(dmr.m_display_material_id);
    }
  }

  // version 1.7 fields 6 June 2006
  if (rc) rc = m_rendering_attributes.Write(file);

  return rc;
}